

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

int __thiscall
btGeneric6DofSpring2Constraint::setLinearLimits
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo2 *info,int row,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  btScalar *pbVar4;
  btScalar *pbVar5;
  long lVar6;
  long lVar7;
  btScalar *pbVar8;
  btRotationalLimitMotor2 *pbVar9;
  long lVar10;
  long lVar11;
  btRotationalLimitMotor2 local_d8;
  btRotationalLimitMotor2 *local_78;
  btScalar *local_70;
  btTransform *local_68;
  btTransform *local_60;
  btVector3 *local_58;
  long local_50;
  ulong local_48;
  btVector3 axis;
  
  lVar7 = 0;
  pbVar8 = &info->erp;
  pbVar9 = this->m_angularLimits;
  lVar11 = 0x4d8;
  local_48 = 2;
  local_50 = 0x4e4;
  lVar10 = 0x330;
  local_78 = pbVar9;
  local_70 = pbVar8;
  local_68 = transA;
  local_60 = transB;
  local_58 = linVelA;
  do {
    local_d8.m_currentLimit = *(int *)((long)(this->m_linearLimits).m_currentLimit + lVar7);
    if (((local_d8.m_currentLimit != 0) ||
        (*(char *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar10 + -0x48) != '\0')) ||
       (*(char *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar10 + -0x42) == '\x01')) {
      local_d8.m_currentPosition =
           *(btScalar *)((long)(this->m_linearLimits).m_currentLinearDiff.m_floats + lVar7);
      local_d8.m_currentLimitErrorHi =
           *(btScalar *)((long)(this->m_linearLimits).m_currentLimitErrorHi.m_floats + lVar7);
      local_d8.m_enableMotor =
           *(bool *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar10 + -0x48);
      local_d8.m_servoMotor =
           *(bool *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar10 + -0x45);
      local_d8.m_servoTarget =
           *(btScalar *)((long)(this->m_linearLimits).m_servoTarget.m_floats + lVar7);
      local_d8.m_enableSpring =
           *(bool *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar10 + -0x42);
      local_d8.m_springStiffness =
           *(btScalar *)((long)(this->m_linearLimits).m_springStiffness.m_floats + lVar7);
      local_d8.m_springStiffnessLimited =
           *(bool *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar10 + -0x1c);
      local_d8.m_springDamping =
           *(btScalar *)((long)(this->m_linearLimits).m_springDamping.m_floats + lVar7);
      local_d8.m_springDampingLimited =
           *(bool *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar10 + -8);
      local_d8.m_currentLimitError =
           *(btScalar *)((long)(this->m_linearLimits).m_currentLimitError.m_floats + lVar7);
      local_d8.m_equilibriumPoint =
           *(btScalar *)((long)(this->m_linearLimits).m_equilibriumPoint.m_floats + lVar7);
      local_d8.m_hiLimit = *(btScalar *)((long)(this->m_linearLimits).m_upperLimit.m_floats + lVar7)
      ;
      local_d8.m_loLimit = *(btScalar *)((long)(this->m_linearLimits).m_lowerLimit.m_floats + lVar7)
      ;
      local_d8.m_maxMotorForce =
           *(btScalar *)((long)(this->m_linearLimits).m_maxMotorForce.m_floats + lVar7);
      local_d8.m_targetVelocity =
           *(btScalar *)((long)(this->m_linearLimits).m_targetVelocity.m_floats + lVar7);
      axis.m_floats[1] =
           (btScalar)
           *(undefined4 *)((long)(this->m_calculatedTransformA).m_basis.m_el[1].m_floats + lVar7);
      axis.m_floats[0] =
           (btScalar)
           *(undefined4 *)((long)(this->m_calculatedTransformA).m_basis.m_el[0].m_floats + lVar7);
      axis.m_floats[2] =
           (btScalar)
           *(undefined4 *)((long)(this->m_calculatedTransformA).m_basis.m_el[2].m_floats + lVar7);
      axis.m_floats[3] = 0.0;
      uVar2 = this->m_flags >> ((byte)lVar7 & 0x1f);
      if ((uVar2 & 1) == 0) {
        pbVar5 = info->cfm;
      }
      else {
        pbVar5 = (btScalar *)((long)(this->m_linearLimits).m_stopCFM.m_floats + lVar7);
      }
      pbVar4 = (btScalar *)((long)(this->m_linearLimits).m_stopERP.m_floats + lVar7);
      if ((uVar2 & 2) == 0) {
        pbVar4 = pbVar8;
      }
      local_d8.m_stopERP = *pbVar4;
      local_d8.m_bounce = *(btScalar *)((long)(this->m_linearLimits).m_bounce.m_floats + lVar7);
      if ((uVar2 & 4) == 0) {
        pbVar4 = info->cfm;
      }
      else {
        pbVar4 = (btScalar *)((long)(this->m_linearLimits).m_motorCFM.m_floats + lVar7);
      }
      local_d8.m_motorCFM = *pbVar4;
      pbVar4 = (btScalar *)((long)(this->m_linearLimits).m_motorERP.m_floats + lVar7);
      if ((uVar2 & 8) == 0) {
        pbVar4 = pbVar8;
      }
      local_d8.m_motorERP = *pbVar4;
      local_d8.m_stopCFM = *pbVar5;
      lVar6 = 0;
      if (lVar7 != 8) {
        lVar6 = lVar10 + -0x32f;
      }
      iVar3 = pbVar9[lVar6].m_currentLimit;
      bVar1 = true;
      if (1 < iVar3 - 1U) {
        if (iVar3 == 4) {
          if (-0.001 <= pbVar9[lVar6].m_currentLimitError) {
            bVar1 = 0.001 < pbVar9[lVar6].m_currentLimitErrorHi;
          }
        }
        else if ((iVar3 != 3) || (ABS(pbVar9[lVar6].m_currentLimitError) <= 0.001)) {
          bVar1 = false;
        }
      }
      iVar3 = *(int *)((long)this + local_50 + (local_48 / 3) * -0x108);
      uVar2 = 0;
      if (1 < iVar3 - 1U) {
        lVar6 = lVar11 + (local_48 / 3) * -0x108;
        if (iVar3 == 4) {
          if (-0.001 <= *(float *)((long)this + lVar6)) {
            uVar2 = (uint)(*(float *)((long)this + lVar6 + 4) <= 0.001);
          }
        }
        else if ((iVar3 != 3) || (ABS(*(float *)((long)this + lVar6)) <= 0.001)) {
          uVar2 = 1;
        }
      }
      if (!bVar1) {
        uVar2 = 1;
      }
      iVar3 = get_limit_motor_info2
                        (this,&local_d8,local_68,local_60,local_58,linVelB,angVelA,angVelB,info,row,
                         &axis,0,uVar2);
      row = iVar3 + row;
      pbVar8 = local_70;
      pbVar9 = local_78;
    }
    lVar11 = lVar11 + 0x58;
    local_48 = local_48 + 1;
    local_50 = local_50 + 0x58;
    lVar7 = lVar7 + 4;
    lVar10 = lVar10 + 1;
  } while (lVar7 != 0xc);
  return row;
}

Assistant:

int btGeneric6DofSpring2Constraint::setLinearLimits(btConstraintInfo2* info, int row, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	//solve linear limits
	btRotationalLimitMotor2 limot;
	for (int i=0;i<3 ;i++ )
	{
		if(m_linearLimits.m_currentLimit[i] || m_linearLimits.m_enableMotor[i] || m_linearLimits.m_enableSpring[i])
		{ // re-use rotational motor code
			limot.m_bounce                 = m_linearLimits.m_bounce[i];
			limot.m_currentLimit           = m_linearLimits.m_currentLimit[i];
			limot.m_currentPosition        = m_linearLimits.m_currentLinearDiff[i];
			limot.m_currentLimitError      = m_linearLimits.m_currentLimitError[i];
			limot.m_currentLimitErrorHi    = m_linearLimits.m_currentLimitErrorHi[i];
			limot.m_enableMotor            = m_linearLimits.m_enableMotor[i];
			limot.m_servoMotor             = m_linearLimits.m_servoMotor[i];
			limot.m_servoTarget            = m_linearLimits.m_servoTarget[i];
			limot.m_enableSpring           = m_linearLimits.m_enableSpring[i];
			limot.m_springStiffness        = m_linearLimits.m_springStiffness[i];
			limot.m_springStiffnessLimited = m_linearLimits.m_springStiffnessLimited[i];
			limot.m_springDamping          = m_linearLimits.m_springDamping[i];
			limot.m_springDampingLimited   = m_linearLimits.m_springDampingLimited[i];
			limot.m_equilibriumPoint       = m_linearLimits.m_equilibriumPoint[i];
			limot.m_hiLimit                = m_linearLimits.m_upperLimit[i];
			limot.m_loLimit                = m_linearLimits.m_lowerLimit[i];
			limot.m_maxMotorForce          = m_linearLimits.m_maxMotorForce[i];
			limot.m_targetVelocity         = m_linearLimits.m_targetVelocity[i];
			btVector3 axis = m_calculatedTransformA.getBasis().getColumn(i);
			int flags = m_flags >> (i * BT_6DOF_FLAGS_AXIS_SHIFT2);
			limot.m_stopCFM  = (flags & BT_6DOF_FLAGS_CFM_STOP2) ? m_linearLimits.m_stopCFM[i] : info->cfm[0];
			limot.m_stopERP  = (flags & BT_6DOF_FLAGS_ERP_STOP2) ? m_linearLimits.m_stopERP[i] : info->erp;
			limot.m_motorCFM = (flags & BT_6DOF_FLAGS_CFM_MOTO2) ? m_linearLimits.m_motorCFM[i] : info->cfm[0];
			limot.m_motorERP = (flags & BT_6DOF_FLAGS_ERP_MOTO2) ? m_linearLimits.m_motorERP[i] : info->erp;

			//rotAllowed is a bit of a magic from the original 6dof. The calculation of it here is something that imitates the original behavior as much as possible.
			int indx1 = (i + 1) % 3;
			int indx2 = (i + 2) % 3;
			int rotAllowed = 1; // rotations around orthos to current axis (it is used only when one of the body is static)
			#define D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION 1.0e-3
			bool indx1Violated = m_angularLimits[indx1].m_currentLimit == 1 ||
				m_angularLimits[indx1].m_currentLimit == 2 ||
				( m_angularLimits[indx1].m_currentLimit == 3 && ( m_angularLimits[indx1].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx1].m_currentLimitError > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) ) ||
				( m_angularLimits[indx1].m_currentLimit == 4 && ( m_angularLimits[indx1].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx1].m_currentLimitErrorHi > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) );
			bool indx2Violated = m_angularLimits[indx2].m_currentLimit == 1 ||
				m_angularLimits[indx2].m_currentLimit == 2 ||
				( m_angularLimits[indx2].m_currentLimit == 3 && ( m_angularLimits[indx2].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx2].m_currentLimitError > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) ) ||
				( m_angularLimits[indx2].m_currentLimit == 4 && ( m_angularLimits[indx2].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx2].m_currentLimitErrorHi > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) );
			if( indx1Violated && indx2Violated )
			{
				rotAllowed = 0;
			}
			row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0, rotAllowed);

		}
	}
	return row;
}